

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

void mpp_av1_fragment_reset(Av1UnitFragment *frag)

{
  undefined8 *puVar1;
  Av1ObuUnit *pAVar2;
  void *ptr;
  long lVar3;
  long lVar4;
  
  if (0 < frag->nb_units) {
    lVar4 = 0x18;
    lVar3 = 0;
    do {
      pAVar2 = frag->units;
      ptr = *(void **)((long)&pAVar2->type + lVar4);
      if (ptr != (void *)0x0) {
        mpp_osal_free("mpp_av1_fragment_reset",ptr);
      }
      lVar3 = lVar3 + 1;
      puVar1 = (undefined8 *)((long)pAVar2 + lVar4 + -0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pAVar2->type + lVar4) = 0;
      lVar4 = lVar4 + 0x20;
    } while (lVar3 < frag->nb_units);
  }
  frag->data = (RK_U8 *)0x0;
  frag->data_size = 0;
  frag->nb_units = 0;
  return;
}

Assistant:

void mpp_av1_fragment_reset(Av1UnitFragment *frag)
{
    int i;

    for (i = 0; i < frag->nb_units; i++) {
        Av1ObuUnit *unit = &frag->units[i];
        MPP_FREE(unit->content);
        unit->data             = NULL;
        unit->data_size        = 0;
    }
    frag->nb_units         = 0;
    frag->data             = NULL;
    frag->data_size        = 0;
}